

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O3

Function * __thiscall
despot::Parser::CreateRewardFunction
          (Function *__return_storage_ptr__,Parser *this,TiXmlElement *e_Func)

{
  mapped_type pVVar1;
  _func_int **pp_Var2;
  pointer pdVar3;
  TiXmlElement *element;
  bool bVar4;
  int t;
  TiXmlElement *pTVar5;
  char *pcVar6;
  long *plVar7;
  TiXmlNode *base;
  mapped_type *ppVVar8;
  TiXmlElement *pTVar9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar10;
  _Base_ptr *pp_Var11;
  pointer pTVar12;
  ulong uVar13;
  mapped_type pVVar14;
  Parser *pPVar15;
  pointer pSVar16;
  undefined8 uVar17;
  long lVar18;
  long lVar19;
  string str;
  Function *func;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  value_tokens;
  vector<double,_std::allocator<double>_> values;
  vector<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_> parents;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  parent_names;
  string name;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  instance;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  undefined1 local_230 [32];
  Parser *local_210;
  Function *local_208;
  pointer local_200;
  pointer local_1f8;
  undefined1 local_1f0 [40];
  vector<double,_std::allocator<double>_> local_1c8;
  vector<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_> local_1a8;
  undefined1 local_188 [16];
  _Alloc_hider local_178;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_170;
  undefined1 local_160 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_148;
  pointer local_138;
  _Base_ptr local_130;
  pointer ppCStack_128;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_120;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_108;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f8;
  TiXmlElement *local_e8;
  vector<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_> local_e0;
  string local_c8;
  undefined1 local_a8 [32];
  string local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  local_208 = __return_storage_ptr__;
  pTVar5 = util::tinyxml::TiXmlNode::FirstChildElement(&e_Func->super_TiXmlNode,"Var");
  pcVar6 = util::tinyxml::TiXmlElement::GetText(pTVar5);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,pcVar6,(allocator<char> *)&local_250);
  local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_88,local_68._M_dataplus._M_p,
             local_68._M_dataplus._M_p +
             (long)(_Vector_base<int,_std::allocator<int>_> *)local_68._M_string_length);
  local_210 = this;
  bVar4 = Variable::IsVariableName(&local_88,&this->reward_vars_);
  std::operator+(&local_250,"In <RewardFunction>: Variable ",&local_68);
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_250);
  paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(plVar7 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar7 == paVar10) {
    local_f8._M_allocated_capacity = paVar10->_M_allocated_capacity;
    local_f8._8_8_ = plVar7[3];
    local_108._M_allocated_capacity = (size_type)&local_f8;
  }
  else {
    local_f8._M_allocated_capacity = paVar10->_M_allocated_capacity;
    local_108._M_allocated_capacity =
         (size_type)
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)*plVar7;
  }
  local_108._8_8_ = plVar7[1];
  *plVar7 = (long)paVar10;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  base = util::tinyxml::TiXmlNode::FirstChild(&e_Func->super_TiXmlNode,"Var");
  Ensure(local_210,bVar4,(string *)&local_108,&base->super_TiXmlBase);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_allocated_capacity != &local_f8) {
    operator_delete((void *)local_108._M_allocated_capacity,local_f8._M_allocated_capacity + 1);
  }
  pPVar15 = local_210;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_250._M_dataplus._M_p != &local_250.field_2) {
    operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  ppVVar8 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_despot::Variable_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_despot::Variable_*>_>_>
            ::operator[](&pPVar15->variables_,&local_68);
  local_188._0_8_ = *ppVVar8;
  local_1a8.super__Vector_base<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1a8.super__Vector_base<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1a8.super__Vector_base<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pTVar5 = util::tinyxml::TiXmlNode::FirstChildElement(&e_Func->super_TiXmlNode,"Parent");
  pcVar6 = util::tinyxml::TiXmlElement::GetText(pTVar5);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_250,pcVar6,(allocator<char> *)local_230);
  local_230._0_8_ = (mapped_type)(local_230 + 0x10);
  std::__cxx11::string::_M_construct<char_const*>((string *)local_230," ","");
  Tokenize(&local_120,&local_250,(string *)local_230);
  if ((mapped_type)local_230._0_8_ != (mapped_type)(local_230 + 0x10)) {
    operator_delete((void *)local_230._0_8_,local_230._16_8_ + 1);
  }
  local_e8 = e_Func;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_250._M_dataplus._M_p != &local_250.field_2) {
    operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
  }
  if (local_120.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      local_120.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    lVar19 = 8;
    uVar13 = 0;
    do {
      local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
      lVar18 = *(long *)((long)local_120.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start + lVar19 + -8);
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_250,lVar18,
                 *(long *)((long)&((local_120.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                          lVar19) + lVar18);
      ppVVar8 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_despot::Variable_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_despot::Variable_*>_>_>
                ::operator[](&pPVar15->variables_,&local_250);
      local_230._0_8_ = *ppVVar8;
      std::vector<despot::NamedVar*,std::allocator<despot::NamedVar*>>::
      emplace_back<despot::NamedVar*>
                ((vector<despot::NamedVar*,std::allocator<despot::NamedVar*>> *)&local_1a8,
                 (NamedVar **)local_230);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_250._M_dataplus._M_p != &local_250.field_2) {
        operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
      }
      uVar13 = uVar13 + 1;
      lVar19 = lVar19 + 0x20;
    } while (uVar13 < (ulong)((long)local_120.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)local_120.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 5));
  }
  std::vector<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_>::vector(&local_e0,&local_1a8)
  ;
  Function::Function(local_208,(NamedVar *)local_188._0_8_,&local_e0);
  element = local_e8;
  if (local_e0.super__Vector_base<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_e0.
                    super__Vector_base<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_e0.
                          super__Vector_base<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_e0.
                          super__Vector_base<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  pTVar5 = GetParameterElement(local_210,element);
  pTVar5 = util::tinyxml::TiXmlNode::FirstChildElement(&pTVar5->super_TiXmlNode,"Entry");
  if (pTVar5 != (TiXmlElement *)0x0) {
    do {
      pVVar14 = (mapped_type)(local_230 + 0x10);
      pTVar9 = util::tinyxml::TiXmlNode::FirstChildElement(&pTVar5->super_TiXmlNode,"Instance");
      pcVar6 = util::tinyxml::TiXmlElement::GetText(pTVar9);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_250,pcVar6,(allocator<char> *)local_230);
      local_230._0_8_ = pVVar14;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_230," ","");
      Tokenize(&local_48,&local_250,(string *)local_230);
      if ((mapped_type)local_230._0_8_ != pVVar14) {
        operator_delete((void *)local_230._0_8_,local_230._16_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_250._M_dataplus._M_p != &local_250.field_2) {
        operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
      }
      local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_250,"rew","");
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_48,
                 &local_250);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_250._M_dataplus._M_p != &local_250.field_2) {
        operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
      }
      local_1c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      local_1c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      local_1c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      pTVar9 = util::tinyxml::TiXmlNode::FirstChildElement(&pTVar5->super_TiXmlNode,"ValueTable");
      pcVar6 = util::tinyxml::TiXmlElement::GetText(pTVar9);
      pPVar15 = (Parser *)&local_250;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)pPVar15,pcVar6,(allocator<char> *)local_230);
      t = ComputeNumOfEntries(pPVar15,&local_48,&local_1a8,(NamedVar *)local_188._0_8_);
      local_230._0_8_ = pVVar14;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_230," ","");
      Tokenize((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)(local_1f0 + 0x10),&local_250,(string *)local_230);
      if ((mapped_type)local_230._0_8_ != pVVar14) {
        operator_delete((void *)local_230._0_8_,local_230._16_8_ + 1);
      }
      lVar19 = local_1f0._24_8_ - local_1f0._16_8_;
      to_string<int>((string *)local_a8,t);
      plVar7 = (long *)std::__cxx11::string::replace((ulong)local_a8,0,(char *)0x0,0x1762dc);
      pp_Var11 = (_Base_ptr *)(plVar7 + 2);
      if ((_Base_ptr *)*plVar7 == pp_Var11) {
        local_130 = *pp_Var11;
        ppCStack_128 = (pointer)plVar7[3];
        aStack_148._8_8_ = &local_130;
      }
      else {
        local_130 = *pp_Var11;
        aStack_148._8_8_ = (_Base_ptr *)*plVar7;
      }
      local_138 = (pointer)plVar7[1];
      *plVar7 = (long)pp_Var11;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      plVar7 = (long *)std::__cxx11::string::append(aStack_148._M_local_buf + 8);
      local_200 = (pointer)local_1f0;
      pSVar16 = (pointer)(plVar7 + 2);
      if ((pointer)*plVar7 == pSVar16) {
        local_1f0._0_8_ = (pSVar16->super_NamedVar).super_Variable._vptr_Variable;
        local_1f0._8_8_ = plVar7[3];
      }
      else {
        local_1f0._0_8_ = (pSVar16->super_NamedVar).super_Variable._vptr_Variable;
        local_200 = (pointer)*plVar7;
      }
      local_1f8 = (pointer)plVar7[1];
      *plVar7 = (long)pSVar16;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      to_string<unsigned_long>
                ((string *)(local_188 + 8),(long)(local_1f0._24_8_ - local_1f0._16_8_) >> 5);
      pSVar16 = (pointer)0xf;
      if (local_200 != (pointer)local_1f0) {
        pSVar16 = (pointer)local_1f0._0_8_;
      }
      if (pSVar16 < (pointer)(local_178._M_p + (long)local_1f8)) {
        uVar17 = (pointer)0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_188._8_8_ != &local_170) {
          uVar17 = local_170._M_allocated_capacity;
        }
        if ((ulong)uVar17 < (pointer)(local_178._M_p + (long)local_1f8)) goto LAB_001535b9;
        plVar7 = (long *)std::__cxx11::string::replace
                                   ((ulong)(local_188 + 8),0,(char *)0x0,(ulong)local_200);
      }
      else {
LAB_001535b9:
        plVar7 = (long *)std::__cxx11::string::_M_append((char *)&local_200,local_188._8_8_);
      }
      pVVar1 = (mapped_type)(plVar7 + 2);
      if ((mapped_type)*plVar7 == pVVar1) {
        local_230._16_8_ = pVVar1->_vptr_Variable;
        local_230._24_8_ = plVar7[3];
        local_230._0_8_ = pVVar14;
      }
      else {
        local_230._16_8_ = pVVar1->_vptr_Variable;
        local_230._0_8_ = (mapped_type)*plVar7;
      }
      local_230._8_8_ = plVar7[1];
      *plVar7 = (long)pVVar1;
      plVar7[1] = 0;
      *(undefined1 *)&pVVar1->_vptr_Variable = 0;
      plVar7 = (long *)std::__cxx11::string::append(local_230);
      local_160._0_8_ = local_160 + 0x10;
      pTVar12 = (pointer)(plVar7 + 2);
      if ((pointer)*plVar7 == pTVar12) {
        local_160._16_8_ =
             (pTVar12->state_ids).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
        aStack_148._M_allocated_capacity = plVar7[3];
      }
      else {
        local_160._16_8_ =
             (pTVar12->state_ids).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
        local_160._0_8_ = (pointer)*plVar7;
      }
      local_160._8_8_ = plVar7[1];
      *plVar7 = (long)pTVar12;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      pTVar9 = util::tinyxml::TiXmlNode::FirstChildElement(&pTVar5->super_TiXmlNode,"ValueTable");
      Ensure(local_210,lVar19 >> 5 == (long)t,(string *)local_160,(TiXmlBase *)pTVar9);
      if ((pointer)local_160._0_8_ != (pointer)(local_160 + 0x10)) {
        operator_delete((void *)local_160._0_8_,(ulong)(local_160._16_8_ + 1));
      }
      if ((mapped_type)local_230._0_8_ != pVVar14) {
        operator_delete((void *)local_230._0_8_,local_230._16_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_188._8_8_ != &local_170) {
        operator_delete((void *)local_188._8_8_,(ulong)(local_170._M_allocated_capacity + 1));
      }
      if (local_200 != (pointer)local_1f0) {
        operator_delete(local_200,
                        (ulong)((long)&(((NamedVar *)local_1f0._0_8_)->super_Variable).
                                       _vptr_Variable + 1));
      }
      if ((_Base_ptr *)aStack_148._8_8_ != &local_130) {
        operator_delete((void *)aStack_148._8_8_,(ulong)((long)&local_130->_M_color + 1));
      }
      if ((_Base_ptr)local_a8._0_8_ != (_Base_ptr)(local_a8 + 0x10)) {
        operator_delete((void *)local_a8._0_8_,local_a8._16_8_ + 1);
      }
      std::vector<double,_std::allocator<double>_>::resize
                (&local_1c8,(long)(local_1f0._24_8_ - local_1f0._16_8_) >> 5);
      pdVar3 = local_1c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      if (local_1f0._24_8_ - local_1f0._16_8_ != 0) {
        lVar18 = (long)(local_1f0._24_8_ - local_1f0._16_8_) >> 5;
        lVar19 = 0;
        pSVar16 = (pointer)local_1f0._16_8_;
        do {
          pp_Var2 = (_func_int **)
                    atof((char *)(pSVar16->super_NamedVar).super_Variable._vptr_Variable);
          (&((Variable *)pdVar3)->_vptr_Variable)[lVar19] = pp_Var2;
          lVar19 = lVar19 + 1;
          pSVar16 = (pointer)&(pSVar16->super_NamedVar).super_Variable.index_;
        } while (lVar18 + (ulong)(lVar18 == 0) != lVar19);
      }
      bVar4 = Function::SetValue(local_208,&local_48,&local_1c8);
      local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_c8,"In <RewardFunction>: Value assignment failed.","");
      pTVar9 = util::tinyxml::TiXmlNode::FirstChildElement(&pTVar5->super_TiXmlNode,"Instance");
      Ensure(local_210,bVar4,&local_c8,(TiXmlBase *)pTVar9);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
        operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
      }
      pTVar5 = util::tinyxml::TiXmlNode::NextSiblingElement(&pTVar5->super_TiXmlNode);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(local_1f0 + 0x10));
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_250._M_dataplus._M_p != &local_250.field_2) {
        operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
      }
      if ((pointer)local_1c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_1c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_1c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_1c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_48);
    } while (pTVar5 != (TiXmlElement *)0x0);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_120);
  if ((pointer)local_1a8.super__Vector_base<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_>
               ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1a8.
                    super__Vector_base<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_1a8.
                          super__Vector_base<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_1a8.
                          super__Vector_base<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  return local_208;
}

Assistant:

Function Parser::CreateRewardFunction(TiXmlElement* e_Func) {
	// <Var>
	string name = GetFirstChildText(e_Func, "Var");

	Ensure(Variable::IsVariableName(name, reward_vars_),
		"In <RewardFunction>: Variable " + name
			+ " has not been declared as a RewardVar vname within <Variable> tag.",
		e_Func->FirstChild("Var"));

	ObsVar* child = static_cast<ObsVar*>(variables_[name]);

	// <Parent>
	vector<NamedVar*> parents;
	vector<string> parent_names = Tokenize(GetFirstChildText(e_Func, "Parent"));
	for (int i = 0; i < parent_names.size(); i++) {
		string str = parent_names[i];
		parents.push_back(static_cast<StateVar*>(variables_[str]));
	}

	Function func(child, parents);

	// <Parameter>
	TiXmlElement* e_Parameter = GetParameterElement(e_Func);
	TiXmlElement* e_Entry = e_Parameter->FirstChildElement("Entry");
	while (e_Entry != NULL) {
		// <Instance>
		vector<string> instance = Tokenize(
			GetFirstChildText(e_Entry, "Instance"));
		instance.push_back(REWARD_VAR_VALUE);

		// <ValueTable>
		vector<double> values;
		string table = GetFirstChildText(e_Entry, "ValueTable");

		int num_entries = ComputeNumOfEntries(instance, parents, child);

		vector<string> value_tokens = Tokenize(table);

		Ensure(num_entries == value_tokens.size(),
			"In <RewardFunction>: " + to_string(num_entries)
				+ " entries expected but " + to_string(value_tokens.size())
				+ " found.", GetFirstChildElement(e_Entry, "ValueTable"));

		values.resize(value_tokens.size());
		for (int i = 0; i < value_tokens.size(); i++) {
			values[i] = atof(value_tokens[i].c_str());
		}

		bool success = func.SetValue(instance, values);

		Ensure(success, "In <RewardFunction>: Value assignment failed.",
			GetFirstChildElement(e_Entry, "Instance"));

		e_Entry = e_Entry->NextSiblingElement();
	}

	return func;
}